

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *determinant,double *pivot)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  double ***pppdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double local_88;
  double local_58;
  
  uVar10 = this->m_row_count;
  pppdVar4 = &this->m;
  if (uVar10 == (this->m_rowmem).m_count) {
    pppdVar4 = &(this->m_rowmem).m_a;
  }
  uVar9 = this->m_col_count;
  if ((int)uVar10 < this->m_col_count) {
    uVar9 = uVar10;
  }
  if ((int)uVar9 < 1) {
    local_58 = 1.0;
    dVar13 = 1.0;
    uVar9 = 0;
  }
  else {
    ppdVar2 = *pppdVar4;
    local_58 = 1.0;
    uVar8 = 1;
    local_88 = 1.0;
    uVar6 = 0;
    do {
      dVar12 = ABS(ppdVar2[uVar6][uVar6]);
      uVar7 = uVar6 + 1;
      uVar10 = (uint)uVar6;
      if ((long)uVar7 < (long)this->m_row_count) {
        uVar11 = uVar6 & 0xffffffff;
        uVar5 = uVar8;
        do {
          if (dVar12 < ABS(ppdVar2[uVar5][uVar6])) {
            uVar11 = uVar5 & 0xffffffff;
            dVar12 = ABS(ppdVar2[uVar5][uVar6]);
          }
          uVar5 = uVar5 + 1;
        } while ((uint)this->m_row_count != uVar5);
      }
      else {
        uVar11 = uVar6 & 0xffffffff;
      }
      dVar13 = dVar12;
      if ((uVar6 != 0) && (local_88 <= dVar12)) {
        dVar13 = local_88;
      }
      if (dVar12 <= zero_tolerance) {
        local_58 = 0.0;
        uVar9 = uVar10;
        break;
      }
      if (uVar6 != uVar11) {
        SwapRows(this,(int)uVar11,uVar10);
        local_58 = -local_58;
      }
      pdVar3 = ppdVar2[uVar6];
      dVar12 = pdVar3[uVar6];
      pdVar3[uVar6] = 1.0;
      ON_ArrayScale(this->m_col_count + ~uVar10,1.0 / dVar12,pdVar3 + uVar7,pdVar3 + uVar7);
      uVar11 = uVar8;
      if ((long)uVar7 < (long)this->m_row_count) {
        do {
          pdVar3 = ppdVar2[uVar11];
          dVar1 = pdVar3[uVar6];
          pdVar3[uVar6] = 0.0;
          if (zero_tolerance < ABS(dVar1)) {
            ON_Array_aA_plus_B(this->m_col_count + ~uVar10,-dVar1,ppdVar2[uVar6] + uVar7,
                               pdVar3 + uVar7,pdVar3 + uVar7);
          }
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 < this->m_row_count);
      }
      local_58 = local_58 * dVar12;
      uVar8 = uVar8 + 1;
      uVar6 = uVar7;
      local_88 = dVar13;
    } while (uVar7 != uVar9);
  }
  *pivot = dVar13;
  *determinant = local_58;
  return uVar9;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double& determinant,
    double& pivot 
    )
{
  double x, piv, det;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = det = 1.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance ) {
      det = 0.0;
      break;
    }
    rank++;

    if ( ix != k )
    {
      // swap rows
      SwapRows( ix, k );
      det = -det;
    }

    // scale row k of matrix and B
    det *= this_m[k][k];
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
      }
    }
  }

  pivot = piv;
  determinant = det;

  return rank;
}